

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::strncasecmp(char *__s1,char *__s2,size_t __n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  char cVar9;
  
  iVar6 = (int)__n;
  if (iVar6 == 0) {
    return 0;
  }
  if (__s1 == (char *)0x0) {
    return -(uint)(__s2 != (char *)0x0);
  }
  lVar4 = 0;
  uVar5 = 0;
  if (0 < iVar6) {
    uVar5 = __n & 0xffffffff;
  }
  while( true ) {
    iVar2 = (int)lVar4;
    if ((int)uVar5 == iVar2) break;
    cVar1 = __s1[lVar4];
    cVar8 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar8 = cVar1;
    }
    cVar1 = __s2[lVar4];
    cVar9 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar9 = cVar1;
    }
    iVar7 = (int)cVar8 - (int)cVar9;
    if (iVar7 != 0) goto LAB_0011bfdc;
    lVar4 = lVar4 + 1;
  }
  iVar7 = 0;
  iVar2 = (int)uVar5;
LAB_0011bfdc:
  iVar3 = 0;
  if (iVar2 != iVar6) {
    iVar3 = iVar7;
  }
  return iVar3;
}

Assistant:

inline int strncasecmp(const char *const str1, const char *const str2, const int l) {
      if (!l) return 0;
      if (!str1) return str2?-1:0;
      const char *nstr1 = str1, *nstr2 = str2;
      int k, diff = 0; for (k = 0; k<l && !(diff = uncase(*nstr1)-uncase(*nstr2)); ++k) { ++nstr1; ++nstr2; }
      return k!=l?diff:0;
    }